

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::PointTestInstance::generatePoints
          (PointTestInstance *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *outPoints)

{
  int iVar1;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> *this_00
  ;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  float extraout_XMM0_Da;
  int local_474;
  MessageBuilder local_470;
  int local_2f0;
  float local_2ec;
  int pointNdx_1;
  MessageBuilder local_2d0;
  int local_14c;
  undefined8 uStack_148;
  int pointNdx;
  undefined8 local_140;
  Vector<float,_4> local_138;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  *local_28;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  *outPoints_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData_local;
  PointTestInstance *pPStack_10;
  int iteration_local;
  PointTestInstance *this_local;
  
  local_28 = outPoints;
  outPoints_local =
       (vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> *)
       outData;
  outData_local._4_4_ = iteration;
  pPStack_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,6);
  if (outData_local._4_4_ == 0) {
    tcu::Vector<float,_4>::Vector(&local_38,0.2,0.8,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,0);
    *(undefined8 *)pvVar3->m_data = local_38.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_38.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_48,0.5,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,1);
    *(undefined8 *)pvVar3->m_data = local_48.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_48.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_58,0.5,0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,2);
    *(undefined8 *)pvVar3->m_data = local_58.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_58.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_68,-0.5,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,3);
    *(undefined8 *)pvVar3->m_data = local_68.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_68.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_78,-0.2,-0.4,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,4);
    *(undefined8 *)pvVar3->m_data = local_78.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_78.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_88,-0.4,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,5);
    *(undefined8 *)pvVar3->m_data = local_88.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_88.m_data._8_8_;
  }
  else if (outData_local._4_4_ == 1) {
    tcu::Vector<float,_4>::Vector(&local_98,-0.499,0.128,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,0);
    *(undefined8 *)pvVar3->m_data = local_98.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_98.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_a8,-0.501,-0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,1);
    *(undefined8 *)pvVar3->m_data = local_a8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_a8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_b8,0.11,-0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,2);
    *(undefined8 *)pvVar3->m_data = local_b8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_b8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_c8,0.11,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,3);
    *(undefined8 *)pvVar3->m_data = local_c8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_c8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_d8,0.88,0.9,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,4);
    *(undefined8 *)pvVar3->m_data = local_d8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_d8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_e8,0.4,1.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,5);
    *(undefined8 *)pvVar3->m_data = local_e8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_e8.m_data._8_8_;
  }
  else if (outData_local._4_4_ == 2) {
    tcu::Vector<float,_4>::Vector(&local_f8,-0.9,-0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,0);
    *(undefined8 *)pvVar3->m_data = local_f8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_f8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_108,0.3,-0.9,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,1);
    *(undefined8 *)pvVar3->m_data = local_108.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_108.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_118,-0.4,-0.1,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,2);
    *(undefined8 *)pvVar3->m_data = local_118.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_118.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_128,-0.11,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,3);
    *(undefined8 *)pvVar3->m_data = local_128.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_128.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_138,0.88,0.7,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,4);
    *(undefined8 *)pvVar3->m_data = local_138.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_138.m_data._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffeb8,-0.4,0.4,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,5);
    *(undefined8 *)pvVar3->m_data = uStack_148;
    *(undefined8 *)(pvVar3->m_data + 2) = local_140;
  }
  this_00 = local_28;
  sVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     outPoints_local);
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  resize(this_00,sVar2);
  for (local_14c = 0; iVar1 = local_14c,
      sVar2 = std::
              vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
              ::size(local_28), iVar1 < (int)sVar2; local_14c = local_14c + 1) {
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outPoints_local,(long)local_14c);
    pvVar4 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](local_28,(long)local_14c);
    *(undefined8 *)(pvVar4->position).m_data = *(undefined8 *)pvVar3->m_data;
    *(undefined8 *)((pvVar4->position).m_data + 2) = *(undefined8 *)(pvVar3->m_data + 2);
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])();
    pvVar4 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](local_28,(long)local_14c);
    pvVar4->pointSize = extraout_XMM0_Da;
  }
  pTVar5 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  tcu::TestLog::operator<<(&local_2d0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [11])"Rendering ");
  _pointNdx_1 = std::
                vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                ::size(local_28);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(unsigned_long *)&pointNdx_1);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [26])" point(s): (point size = ");
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])();
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_2ec);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x12d99d9);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2d0);
  for (local_2f0 = 0; iVar1 = local_2f0,
      sVar2 = std::
              vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
              ::size(local_28), iVar1 < (int)sVar2; local_2f0 = local_2f0 + 1) {
    pTVar5 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_470,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_470,(char (*) [7])"Point ");
    local_474 = local_2f0 + 1;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_474);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x13855b7);
    pvVar4 = std::
             vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ::operator[](local_28,(long)local_2f0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&pvVar4->position);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_470);
  }
  return;
}

Assistant:

void PointTestInstance::generatePoints (int iteration, std::vector<tcu::Vec4>& outData, std::vector<PointSceneSpec::ScenePoint>& outPoints)
{
	outData.resize(6);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.2f,  0.8f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,  0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.5f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(-0.2f, -0.4f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(-0.4f,  0.2f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(   0.4f,   1.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  0.3f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( -0.4f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.11f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f);
			break;
	}

	outPoints.resize(outData.size());
	for (int pointNdx = 0; pointNdx < (int)outPoints.size(); ++pointNdx)
	{
		outPoints[pointNdx].position = outData[pointNdx];
		outPoints[pointNdx].pointSize = getPointSize();
	}

	// log
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Rendering " << outPoints.size() << " point(s): (point size = " << getPointSize() << ")" << tcu::TestLog::EndMessage;
	for (int pointNdx = 0; pointNdx < (int)outPoints.size(); ++pointNdx)
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Point " << (pointNdx+1) << ":\t" << outPoints[pointNdx].position << tcu::TestLog::EndMessage;
}